

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
duckdb::GetBaseStatsUnifier(LogicalType *type)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  LogicalType *in_RSI;
  unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_> in_RDI;
  uint8_t scale;
  uint8_t width;
  unique_ptr<duckdb::BlobStatsUnifier,_std::default_delete<duckdb::BlobStatsUnifier>_>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  uchar *in_stack_ffffffffffffff40;
  uchar *in_stack_ffffffffffffff48;
  
  LVar1 = LogicalType::id(in_RSI);
  switch(LVar1) {
  case BOOLEAN:
    make_uniq<duckdb::NullStatsUnifier>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NullStatsUnifier,std::default_delete<std::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>>>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>,_true>::
    ~unique_ptr((unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>,_true>
                 *)0x6bf404);
    break;
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case UTINYINT:
  case USMALLINT:
    make_uniq<duckdb::NumericStatsUnifier<int>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<int>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<int>,_std::default_delete<duckdb::NumericStatsUnifier<int>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<int>,_std::default_delete<duckdb::NumericStatsUnifier<int>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<int>,_std::default_delete<duckdb::NumericStatsUnifier<int>_>,_true>
                   *)0x6bf435);
    break;
  case BIGINT:
    make_uniq<duckdb::NumericStatsUnifier<long>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<long>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<long>,_std::default_delete<duckdb::NumericStatsUnifier<long>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<long>,_std::default_delete<duckdb::NumericStatsUnifier<long>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<long>,_std::default_delete<duckdb::NumericStatsUnifier<long>_>,_true>
                   *)0x6bf497);
    break;
  case DATE:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::date_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::date_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::date_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::date_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::date_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::date_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::date_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::date_t>_>,_true>
                   *)0x6bf466);
    break;
  case TIME:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::dtime_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::dtime_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::dtime_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::dtime_t>_>,_true>
                   *)0x6bf4c8);
    break;
  case TIMESTAMP_SEC:
  case TIMESTAMP:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_t>_>,_true>
                   *)0x6bf4f9);
    break;
  case TIMESTAMP_MS:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_ms_t>_>,_true>
                   *)0x6bf55b);
    break;
  case TIMESTAMP_NS:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_ns_t>_>,_true>
                   *)0x6bf58c);
    break;
  case DECIMAL:
    duckdb::DecimalType::GetWidth(in_RSI);
    duckdb::DecimalType::GetScale(in_RSI);
    PVar2 = LogicalType::InternalType(in_RSI);
    if ((PVar2 == INT16) || (PVar2 == INT32)) {
      make_uniq<duckdb::DecimalStatsUnifier<int>,unsigned_char&,unsigned_char&>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
      unique_ptr<duckdb::DecimalStatsUnifier<int>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
                ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                  *)CONCAT17(PVar2,in_stack_ffffffffffffff20),
                 (unique_ptr<duckdb::DecimalStatsUnifier<int>,_std::default_delete<duckdb::DecimalStatsUnifier<int>_>_>
                  *)in_stack_ffffffffffffff18);
      unique_ptr<duckdb::DecimalStatsUnifier<int>,_std::default_delete<duckdb::DecimalStatsUnifier<int>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::DecimalStatsUnifier<int>,_std::default_delete<duckdb::DecimalStatsUnifier<int>_>,_true>
                     *)0x6bf6e7);
    }
    else if (PVar2 == INT64) {
      make_uniq<duckdb::DecimalStatsUnifier<long>,unsigned_char&,unsigned_char&>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
      unique_ptr<duckdb::DecimalStatsUnifier<long>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
                ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                  *)CONCAT17(PVar2,in_stack_ffffffffffffff20),
                 (unique_ptr<duckdb::DecimalStatsUnifier<long>,_std::default_delete<duckdb::DecimalStatsUnifier<long>_>_>
                  *)in_stack_ffffffffffffff18);
      unique_ptr<duckdb::DecimalStatsUnifier<long>,_std::default_delete<duckdb::DecimalStatsUnifier<long>_>,_true>
      ::~unique_ptr((unique_ptr<duckdb::DecimalStatsUnifier<long>,_std::default_delete<duckdb::DecimalStatsUnifier<long>_>,_true>
                     *)0x6bf719);
    }
    else {
      make_uniq<duckdb::NullStatsUnifier>();
      unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
      unique_ptr<duckdb::NullStatsUnifier,std::default_delete<std::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>>>,void>
                ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                  *)CONCAT17(PVar2,in_stack_ffffffffffffff20),
                 (unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>_>
                  *)in_stack_ffffffffffffff18);
      unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>,_true>::
      ~unique_ptr((unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>,_true>
                   *)0x6bf741);
    }
    break;
  case FLOAT:
    make_uniq<duckdb::NumericStatsUnifier<float>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<float>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<float>,_std::default_delete<duckdb::NumericStatsUnifier<float>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<float>,_std::default_delete<duckdb::NumericStatsUnifier<float>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<float>,_std::default_delete<duckdb::NumericStatsUnifier<float>_>,_true>
                   *)0x6bf63e);
    break;
  case DOUBLE:
  case UHUGEINT:
  case HUGEINT:
    make_uniq<duckdb::NumericStatsUnifier<double>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<double>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<double>,_std::default_delete<duckdb::NumericStatsUnifier<double>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<double>,_std::default_delete<duckdb::NumericStatsUnifier<double>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<double>,_std::default_delete<duckdb::NumericStatsUnifier<double>_>,_true>
                   *)0x6bf666);
    break;
  case VARCHAR:
    make_uniq<duckdb::StringStatsUnifier>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::StringStatsUnifier,std::default_delete<std::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>>>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::StringStatsUnifier,_std::default_delete<duckdb::StringStatsUnifier>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::StringStatsUnifier,_std::default_delete<duckdb::StringStatsUnifier>,_true>::
    ~unique_ptr((unique_ptr<duckdb::StringStatsUnifier,_std::default_delete<duckdb::StringStatsUnifier>,_true>
                 *)0x6bf78e);
    break;
  case BLOB:
    make_uniq<duckdb::BlobStatsUnifier>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::BlobStatsUnifier,std::default_delete<std::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>>>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    unique_ptr<duckdb::BlobStatsUnifier,_std::default_delete<duckdb::BlobStatsUnifier>,_true>::
    ~unique_ptr((unique_ptr<duckdb::BlobStatsUnifier,_std::default_delete<duckdb::BlobStatsUnifier>,_true>
                 *)0x6bf769);
    break;
  case INTERVAL:
  case ENUM:
  default:
    make_uniq<duckdb::NullStatsUnifier>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NullStatsUnifier,std::default_delete<std::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>>>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>,_true>::
    ~unique_ptr((unique_ptr<duckdb::NullStatsUnifier,_std::default_delete<duckdb::NullStatsUnifier>,_true>
                 *)0x6bf7dc);
    break;
  case UINTEGER:
    make_uniq<duckdb::NumericStatsUnifier<unsigned_int>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<unsigned_int>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<unsigned_int>,_std::default_delete<duckdb::NumericStatsUnifier<unsigned_int>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<unsigned_int>,_std::default_delete<duckdb::NumericStatsUnifier<unsigned_int>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<unsigned_int>,_std::default_delete<duckdb::NumericStatsUnifier<unsigned_int>_>,_true>
                   *)0x6bf5ee);
    break;
  case UBIGINT:
    make_uniq<duckdb::NumericStatsUnifier<unsigned_long>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<unsigned_long>,std::default_delete<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::unique_ptr>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<unsigned_long>,_std::default_delete<duckdb::NumericStatsUnifier<unsigned_long>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<unsigned_long>,_std::default_delete<duckdb::NumericStatsUnifier<unsigned_long>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<unsigned_long>,_std::default_delete<duckdb::NumericStatsUnifier<unsigned_long>_>,_true>
                   *)0x6bf616);
    break;
  case TIMESTAMP_TZ:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::timestamp_tz_t>_>,_true>
                   *)0x6bf52a);
    break;
  case TIME_TZ:
    make_uniq<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>,std::default_delete<duckdb::NumericStatsUnifier>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>_>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>,_std::default_delete<duckdb::NumericStatsUnifier<duckdb::dtime_tz_t>_>,_true>
                   *)0x6bf5bd);
    break;
  case UUID:
    make_uniq<duckdb::UUIDStatsUnifier>();
    unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>,true>::
    unique_ptr<duckdb::UUIDStatsUnifier,std::default_delete<std::unique_ptr<duckdb::ColumnStatsUnifier,std::default_delete<duckdb::ColumnStatsUnifier>>>,void>
              ((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
               (unique_ptr<duckdb::UUIDStatsUnifier,_std::default_delete<duckdb::UUIDStatsUnifier>_>
                *)in_stack_ffffffffffffff18);
    unique_ptr<duckdb::UUIDStatsUnifier,_std::default_delete<duckdb::UUIDStatsUnifier>,_true>::
    ~unique_ptr((unique_ptr<duckdb::UUIDStatsUnifier,_std::default_delete<duckdb::UUIDStatsUnifier>,_true>
                 *)0x6bf7b3);
  }
  return (unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>)
         (__uniq_ptr_impl<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnStatsUnifier_*,_std::default_delete<duckdb::ColumnStatsUnifier>_>
           .super__Head_base<0UL,_duckdb::ColumnStatsUnifier_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ColumnStatsUnifier> GetBaseStatsUnifier(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN:
		return make_uniq<NullStatsUnifier>();
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
		return make_uniq<NumericStatsUnifier<int32_t>>();
	case LogicalTypeId::DATE:
		return make_uniq<NumericStatsUnifier<date_t>>();
	case LogicalTypeId::BIGINT:
		return make_uniq<NumericStatsUnifier<int64_t>>();
	case LogicalTypeId::TIME:
		return make_uniq<NumericStatsUnifier<dtime_t>>();
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP:
		return make_uniq<NumericStatsUnifier<timestamp_t>>();
	case LogicalTypeId::TIMESTAMP_TZ:
		return make_uniq<NumericStatsUnifier<timestamp_tz_t>>();
	case LogicalTypeId::TIMESTAMP_MS:
		return make_uniq<NumericStatsUnifier<timestamp_ms_t>>();
	case LogicalTypeId::TIMESTAMP_NS:
		return make_uniq<NumericStatsUnifier<timestamp_ns_t>>();
	case LogicalTypeId::TIME_TZ:
		return make_uniq<NumericStatsUnifier<dtime_tz_t>>();
	case LogicalTypeId::UINTEGER:
		return make_uniq<NumericStatsUnifier<uint32_t>>();
	case LogicalTypeId::UBIGINT:
		return make_uniq<NumericStatsUnifier<uint64_t>>();
	case LogicalTypeId::FLOAT:
		return make_uniq<NumericStatsUnifier<float>>();
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::DOUBLE:
		return make_uniq<NumericStatsUnifier<double>>();
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
		case PhysicalType::INT32:
			return make_uniq<DecimalStatsUnifier<int32_t>>(width, scale);
		case PhysicalType::INT64:
			return make_uniq<DecimalStatsUnifier<int64_t>>(width, scale);
		default:
			return make_uniq<NullStatsUnifier>();
		}
	}
	case LogicalTypeId::BLOB:
		return make_uniq<BlobStatsUnifier>();
	case LogicalTypeId::VARCHAR:
		return make_uniq<StringStatsUnifier>();
	case LogicalTypeId::UUID:
		return make_uniq<UUIDStatsUnifier>();
	case LogicalTypeId::INTERVAL:;
	case LogicalTypeId::ENUM:
	default:
		return make_uniq<NullStatsUnifier>();
	}
}